

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcErrorList.cpp
# Opt level: O2

int __thiscall GrcErrorList::ErrorsAtLine(GrcErrorList *this,int nLine,int *piperrFirst)

{
  pointer ppGVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  pointer ppGVar5;
  int iVar6;
  ulong uVar7;
  
  ppGVar1 = (this->m_vperr).super__Vector_base<GrcErrorItem_*,_std::allocator<GrcErrorItem_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar4 = (ulong)((long)(this->m_vperr).
                        super__Vector_base<GrcErrorItem_*,_std::allocator<GrcErrorItem_*>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)ppGVar1) >> 3;
  iVar3 = (int)uVar4;
  uVar7 = 0;
  if (0 < iVar3) {
    uVar7 = uVar4 & 0xffffffff;
  }
  iVar6 = -1;
  uVar4 = 0;
  ppGVar5 = ppGVar1;
  do {
    ppGVar5 = ppGVar5 + 1;
    iVar2 = 0;
    if (uVar4 == uVar7) {
LAB_00146a35:
      *piperrFirst = iVar6;
      return iVar2;
    }
    if (nLine <= (ppGVar1[uVar4]->m_lnf).m_nLinePre) {
      iVar2 = 0;
      if ((ppGVar1[uVar4 & 0xffffffff]->m_lnf).m_nLinePre <= nLine) {
        iVar2 = 1;
        while ((iVar6 = (int)uVar4, iVar6 + iVar2 < iVar3 &&
               (((*ppGVar5)->m_lnf).m_nLinePre == nLine))) {
          iVar2 = iVar2 + 1;
          ppGVar5 = ppGVar5 + 1;
        }
      }
      goto LAB_00146a35;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

int GrcErrorList::ErrorsAtLine(int nLine, int * piperrFirst)
{
	int iperrFirst = 0;
	while (iperrFirst < signed(m_vperr.size()) && m_vperr[iperrFirst]->PreProcessedLine() < nLine)
		iperrFirst++;

	if (iperrFirst >= signed(m_vperr.size()) || nLine < m_vperr[iperrFirst]->PreProcessedLine())
	{
		*piperrFirst = -1;
		return 0;
	}

	int cperr = 1;
	while (iperrFirst + cperr < signed(m_vperr.size()) &&
		m_vperr[iperrFirst + cperr]->PreProcessedLine() == nLine)
	{
		cperr++;
	}

	*piperrFirst = iperrFirst;
	return cperr;
}